

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O3

int comex_fence_proc(int proc,comex_group_t group)

{
  int iVar1;
  undefined8 in_RAX;
  int *notify;
  char *__assertion;
  int size;
  int world_proc;
  undefined8 local_28;
  
  local_28 = in_RAX;
  iVar1 = comex_group_size(group,(int *)&local_28);
  if (iVar1 == 0) {
    if (proc < 0) {
      __assertion = "proc >= 0";
    }
    else {
      if (proc < (int)local_28) {
        if (group != 0) {
          comex_group_translate_world(group,proc,(int *)((long)&local_28 + 4));
          proc = local_28._4_4_;
        }
        if ((proc != l_state.rank) && (fence_array[proc] != '\0')) {
          notify = (int *)_my_malloc(4);
          *notify = 1;
          _send_fence_message(proc,notify);
          while (0 < *notify) {
            comex_make_progress();
          }
          fence_array[proc] = '\0';
          free(notify);
        }
        return 0;
      }
      __assertion = "proc < size";
    }
  }
  else {
    __assertion = "COMEX_SUCCESS == ierr";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x448,"int comex_fence_proc(int, comex_group_t)");
}

Assistant:

int comex_fence_proc(int proc, comex_group_t group)
{
    int *notify = NULL;

    CHECK_GROUP(group,proc);
#if DEBUG
    printf("[%d] comex_fence_proc(proc=%d,group=$d)\n",
            l_state.rank, proc, group);
#endif

    /* Corner case */
    if (proc == l_state.rank) {
        return COMEX_SUCCESS;
    }

    /* are there outstanding put/acc requests to proc? */
    if (!fence_array[proc]) {
        return COMEX_SUCCESS;
    }

    /* we allocate the notifier on the heap in order to avoid reentry
     * into this function causing the same stack address to be reused */
    notify = _my_malloc(sizeof(int));
    *notify = 1;

    _send_fence_message(proc, notify);

    while (*notify > 0) {
        comex_make_progress();
    }

    fence_array[proc] = 0;

    _my_free(notify);

    return COMEX_SUCCESS;
}